

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::RE2(RE2 *this,StringPiece *pattern,Options *options)

{
  long in_RDI;
  Options *in_stack_00000470;
  StringPiece *in_stack_00000478;
  RE2 *in_stack_00000480;
  
  Options::Options((Options *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x48));
  std::once_flag::once_flag((once_flag *)(in_RDI + 0x88));
  std::once_flag::once_flag((once_flag *)(in_RDI + 0x8c));
  std::once_flag::once_flag((once_flag *)(in_RDI + 0x90));
  Init(in_stack_00000480,in_stack_00000478,in_stack_00000470);
  return;
}

Assistant:

RE2::RE2(const StringPiece& pattern, const Options& options) {
  Init(pattern, options);
}